

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall
wasm::Literal::remS(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  BasicType BVar1;
  Literal *other_local;
  Literal *this_local;
  
  BVar1 = wasm::Type::getBasic(&this->type);
  if (BVar1 == i32) {
    Literal(__return_storage_ptr__,(this->field_0).i32 % (other->field_0).i32);
  }
  else {
    if (BVar1 != i64) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x525);
    }
    Literal(__return_storage_ptr__,(this->field_0).i64 % (other->field_0).i64);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::remS(const Literal& other) const {
  switch (type.getBasic()) {
    case Type::i32:
      return Literal(i32 % other.i32);
    case Type::i64:
      return Literal(i64 % other.i64);
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}